

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O2

void dirSAVECPR(void)

{
  byte *__ptr;
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  FILE *__s;
  size_t sVar5;
  CDevicePage *pCVar6;
  long lVar7;
  int page;
  uint uVar8;
  aint val;
  undefined4 uStack_7c;
  undefined4 local_78;
  FILE *ff;
  path fnaam;
  
  if (pass != 3) {
    SkipToEol(&lp);
    return;
  }
  bVar1 = IsAmstradPLUSDevice(DeviceID);
  if (!bVar1) {
    Error("[SAVECPR] is allowed only in AMSTRADCPCPLUS device mode",(char *)0x0,SUPPRESS);
    return;
  }
  GetOutputFileName_abi_cxx11_(&fnaam,&lp);
  cVar2 = std::filesystem::__cxx11::path::has_filename();
  if (cVar2 == '\0') {
    Error("[SAVECPR] CPR file name is empty",(char *)0x0,SUPPRESS);
    goto LAB_00112568;
  }
  bVar1 = anyComma(&lp);
  if (bVar1) {
    iVar3 = SkipBlanks();
    if (iVar3 != 0) {
      Error("[SAVECPR] only a size from 1 (16KiB) to 32 (512KiB) is allowed",(char *)0x0,SUPPRESS);
    }
    iVar3 = ParseExpression(&lp,&val);
    if (iVar3 == 0) goto LAB_00112568;
    uVar8 = val;
    if (val - 0x21U < 0xffffffe0) {
      Error("[SAVECPR] only a size from 1 (16KiB) to 32 (512KiB) is allowed",(char *)0x0,SUPPRESS);
      goto LAB_00112568;
    }
  }
  else {
    uVar8 = 0x20;
  }
  __s = (FILE *)SJ_fopen(&fnaam,"wb");
  ff = (FILE *)__s;
  if (__s == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string((string *)&val,&fnaam);
    Error("[SAVECPR] Error opening file for write",_val,PASS3);
    std::__cxx11::string::~string((string *)&val);
  }
  else {
    _val = (char *)0x2020202046464952;
    local_78 = 0x21534d41;
    uVar4 = uVar8 * 0x4008 | 4;
    for (lVar7 = 4; lVar7 != 8; lVar7 = lVar7 + 1) {
      *(char *)((long)&val + lVar7) = (char)uVar4;
      uVar4 = uVar4 >> 8;
    }
    sVar5 = fwrite(&val,1,0xc,__s);
    if (sVar5 == 0xc) {
      uVar4 = 0;
      do {
        if (uVar4 == uVar8) {
          fclose(__s);
          goto LAB_00112568;
        }
        _val = (pointer)(CONCAT44(uStack_7c,
                                  CONCAT13((char)((ulong)uVar4 % 10),
                                           CONCAT12((char)(((ulong)uVar4 / 10) % 10),0x6263))) |
                        0x30300000);
        pCVar6 = CDevice::GetPage(Device,uVar4);
        iVar3 = pCVar6->Size;
        for (lVar7 = 4; lVar7 != 8; lVar7 = lVar7 + 1) {
          *(char *)((long)&val + lVar7) = (char)iVar3;
          iVar3 = iVar3 >> 8;
        }
        sVar5 = fwrite(&val,1,8,__s);
        if (sVar5 != 8) break;
        pCVar6 = CDevice::GetPage(Device,uVar4);
        __ptr = pCVar6->RAM;
        pCVar6 = CDevice::GetPage(Device,uVar4);
        sVar5 = fwrite(__ptr,1,(long)pCVar6->Size,__s);
        pCVar6 = CDevice::GetPage(Device,uVar4);
        uVar4 = uVar4 + 1;
      } while (pCVar6->Size == (int)sVar5);
    }
    anon_unknown.dwarf_1f4b0::writeError(&fnaam,&ff);
  }
  Error("[SAVECPR] Error writing file (Disk full?)",(char *)0x0,IF_FIRST);
LAB_00112568:
  std::filesystem::__cxx11::path::~path(&fnaam);
  return;
}

Assistant:

void dirSAVECPR() {
	if (pass != LASTPASS) {
		SkipToEol(lp);
		return;
	}
	if (!IsAmstradPLUSDevice(DeviceID)) {
		Error("[SAVECPR] is allowed only in AMSTRADCPCPLUS device mode", NULL, SUPPRESS);
		return;
	}
	const std::filesystem::path fnaam = GetOutputFileName(lp);
	if (!fnaam.has_filename()) {
		Error("[SAVECPR] CPR file name is empty", NULL, SUPPRESS);
		return;
	}
	int cprSize = 32;
	if (anyComma(lp)) {
		if (SkipBlanks()) Error(err_txt_size, NULL, SUPPRESS);	// return will happen on ParseExpression
		aint val;
		if (!ParseExpression(lp, val)) return;
		if ((val < 1) || (val > 32)) {
			Error(err_txt_size, NULL, SUPPRESS);
			return;
		}
		cprSize = val;
	}
	if (!SaveCPR(fnaam, cprSize)) Error("[SAVECPR] Error writing file (Disk full?)", NULL, IF_FIRST);
}